

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

int NeedsFilter2_C(uint8_t *p,int step,int t,int it)

{
  uint uVar1;
  uint uVar2;
  bool local_3d;
  int q3;
  int q2;
  int q1;
  int q0;
  int p0;
  int p1;
  int p2;
  int p3;
  int it_local;
  int t_local;
  int step_local;
  uint8_t *p_local;
  uint local_4;
  
  uVar1 = (uint)p[step * -2];
  uVar2 = (uint)p[step];
  if (t < (int)((uint)abs0[(long)(int)((uint)p[-step] - (uint)*p) + 0xff] * 4 +
               (uint)abs0[(long)(int)(uVar1 - uVar2) + 0xff])) {
    local_4 = 0;
  }
  else {
    local_3d = false;
    if (((((int)(uint)abs0[(long)(int)((uint)p[step * -4] - (uint)p[step * -3]) + 0xff] <= it) &&
         (local_3d = false, (int)(uint)abs0[(long)(int)(p[step * -3] - uVar1) + 0xff] <= it)) &&
        (local_3d = false, (int)(uint)abs0[(long)(int)(uVar1 - p[-step]) + 0xff] <= it)) &&
       ((local_3d = false,
        (int)(uint)abs0[(long)(int)((uint)p[step * 3] - (uint)p[step << 1]) + 0xff] <= it &&
        (local_3d = false, (int)(uint)abs0[(long)(int)(p[step << 1] - uVar2) + 0xff] <= it)))) {
      local_3d = (int)(uint)abs0[(long)(int)(uVar2 - *p) + 0xff] <= it;
    }
    local_4 = (uint)local_3d;
  }
  return local_4;
}

Assistant:

static WEBP_INLINE int NeedsFilter2_C(const uint8_t* p,
                                      int step, int t, int it) {
  const int p3 = p[-4 * step], p2 = p[-3 * step], p1 = p[-2 * step];
  const int p0 = p[-step], q0 = p[0];
  const int q1 = p[step], q2 = p[2 * step], q3 = p[3 * step];
  if ((4 * VP8kabs0[p0 - q0] + VP8kabs0[p1 - q1]) > t) return 0;
  return VP8kabs0[p3 - p2] <= it && VP8kabs0[p2 - p1] <= it &&
         VP8kabs0[p1 - p0] <= it && VP8kabs0[q3 - q2] <= it &&
         VP8kabs0[q2 - q1] <= it && VP8kabs0[q1 - q0] <= it;
}